

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

bool __thiscall
cmCTest::RunTest(cmCTest *this,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *argv,string *output,int *retVal,ostream *log,cmDuration testTimeOut,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *environment,Encoding encoding)

{
  pointer *out;
  rep_conflict rVar1;
  anon_class_40_5_31838fda onRead;
  anon_class_24_3_1d514287 onFinish;
  int *piVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  pointer pPVar6;
  ostream *poVar7;
  char *pcVar8;
  const_reference pvVar9;
  string *psVar10;
  pointer pPVar11;
  cmUVProcessChainBuilder *this_00;
  uv_loop_t *ctx;
  uv_pipe_s *handle;
  ulong uVar12;
  bool local_f3a;
  bool local_eaa;
  bool local_e51;
  bool local_e41;
  byte local_e31;
  string local_e30 [32];
  undefined1 local_e10 [8];
  ostringstream cmCTestLog_msg_5;
  undefined1 local_c98 [8];
  string outerr_1;
  undefined1 local_c58 [8];
  ostringstream cmCTestLog_msg_4;
  undefined1 local_ae0 [8];
  string outerr;
  pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  exception;
  Status *status;
  string local_a88 [7];
  bool result;
  undefined1 local_a68 [8];
  ostringstream cmCTestLog_msg_3;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_8f0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_8e8;
  vector<char,_std::allocator<char>_> local_8e0;
  byte local_8c1;
  cmCTest *pcStack_8c0;
  bool complete;
  undefined1 *puStack_8b8;
  ostream **local_8b0;
  cmCTest *local_8a8;
  undefined1 *puStack_8a0;
  int **local_898;
  unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  *puStack_890;
  ostream **local_888;
  undefined1 local_880 [8];
  unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> outputHandle;
  uv_pipe_ptr outputStream;
  undefined1 local_860 [7];
  cmProcessOutput processOutput;
  cmUVProcessChain chain;
  undefined1 local_838 [8];
  ostringstream cmCTestLog_msg_2;
  undefined1 local_6c0 [8];
  cmUVProcessChainBuilder builder;
  unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  local_658;
  unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  saveEnv;
  vector<char,_std::allocator<char>_> tempOutput;
  undefined1 local_618 [8];
  ostringstream cmCTestLog_msg_1;
  string local_4a0 [32];
  unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  local_480;
  unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  local_478;
  unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  saveEnv_1;
  duration<double,_std::ratio<1L,_1L>_> local_450;
  duration<double,_std::ratio<1L,_1L>_> local_448;
  reference local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  ostringstream oss;
  cmCTest local_290;
  cmCTest inst;
  allocator<char> local_261;
  duration<double,_std::ratio<1L,_1L>_> local_260;
  string local_258;
  ostringstream local_228 [8];
  ostringstream cmCTestLog_msg;
  int local_ac;
  duration<long,_std::ratio<1L,_1L>_> local_a8;
  cmCTest *local_a0;
  duration<double,_std::ratio<1L,_1L>_> local_98;
  duration<double,_std::ratio<1L,_1L>_> local_90;
  duration<double,_std::ratio<1L,_1L>_> local_88;
  duration<double,_std::ratio<1L,_1L>_> local_80;
  int local_74;
  duration<long,_std::ratio<60L,_1L>_> local_70;
  duration<double,_std::ratio<1L,_1L>_> local_68;
  duration<double,_std::ratio<1L,_1L>_> local_60;
  duration<double,_std::ratio<1L,_1L>_> local_58;
  cmDuration timeout;
  bool modifyEnv;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *environment_local;
  ostream *log_local;
  int *retVal_local;
  string *output_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *argv_local;
  cmCTest *this_local;
  cmDuration testTimeOut_local;
  
  local_e31 = 0;
  environment_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)log;
  log_local = (ostream *)retVal;
  retVal_local = (int *)output;
  output_local = (string *)argv;
  argv_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  this_local = (cmCTest *)testTimeOut.__r;
  if (environment !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    bVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(environment);
    local_e31 = bVar3 ^ 0xff;
  }
  timeout.__r._7_1_ = local_e31 & 1;
  local_58.__r = (rep_conflict)GetRemainingTimeAllowed(this);
  local_60.__r = (rep_conflict)MaxDuration();
  bVar3 = std::chrono::operator!=(&local_58,&local_60);
  if (bVar3) {
    local_74 = 2;
    std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
              ((duration<long,std::ratio<60l,1l>> *)&local_70,&local_74);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<60l,1l>,void>
              ((duration<double,std::ratio<1l,1l>> *)&local_68,&local_70);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator-=(&local_58,&local_68);
  }
  pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  local_80 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
  bVar3 = std::chrono::operator>(&pPVar6->TimeOut,&local_80);
  local_e41 = false;
  if (bVar3) {
    pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    local_e41 = std::chrono::operator<(&pPVar6->TimeOut,&local_58);
  }
  if (local_e41 != false) {
    pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    local_58.__r = (pPVar6->TimeOut).__r;
  }
  local_88 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
  bVar3 = std::chrono::operator>((duration<double,_std::ratio<1L,_1L>_> *)&this_local,&local_88);
  local_e51 = false;
  if (bVar3) {
    local_90.__r = (rep_conflict)GetRemainingTimeAllowed(this);
    local_e51 = std::chrono::operator<
                          ((duration<double,_std::ratio<1L,_1L>_> *)&this_local,&local_90);
  }
  if (local_e51 != false) {
    local_58.__r = (rep_conflict)this_local;
  }
  local_98 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
  bVar3 = std::chrono::operator<=(&local_58,&local_98);
  if (bVar3) {
    local_ac = 1;
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1l>> *)&local_a8,&local_ac);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1l>,void>
              ((duration<double,std::ratio<1l,1l>> *)&local_a0,&local_a8);
    local_58.__r = (rep_conflict)local_a0;
  }
  std::__cxx11::ostringstream::ostringstream(local_228);
  poVar7 = std::operator<<((ostream *)local_228,"Test timeout computed to be: ");
  local_260.__r = (rep_conflict)MaxDuration();
  bVar3 = std::chrono::operator==(&local_58,&local_260);
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"infinite",&local_261);
  }
  else {
    uVar4 = cmDurationTo<unsigned_int>(&local_58);
    std::__cxx11::to_string(&local_258,uVar4);
  }
  poVar7 = std::operator<<(poVar7,(string *)&local_258);
  std::operator<<(poVar7,"\n");
  std::__cxx11::string::~string((string *)&local_258);
  if (bVar3) {
    std::allocator<char>::~allocator(&local_261);
  }
  std::__cxx11::ostringstream::str();
  pcVar8 = (char *)std::__cxx11::string::c_str();
  Log(this,5,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx",
      0x4cd,pcVar8,false);
  std::__cxx11::string::~string((string *)&inst);
  std::__cxx11::ostringstream::~ostringstream(local_228);
  pvVar9 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)output_local,0);
  psVar10 = cmSystemTools::GetCTestCommand_abi_cxx11_();
  bVar3 = cmsys::SystemTools::SameFile(pvVar9,psVar10);
  if ((bVar3) &&
     (pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                         (&this->Impl), (pPVar6->ForceNewCTestProcess & 1U) == 0)) {
    cmCTest(&local_290);
    pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    pPVar11 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                        (&local_290.Impl);
    std::__cxx11::string::operator=((string *)&pPVar11->ConfigType,(string *)&pPVar6->ConfigType);
    pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&local_290.Impl);
    (pPVar6->TimeOut).__r = local_58.__r;
    std::__cxx11::ostringstream::ostringstream
              ((ostringstream *)
               &args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    out = &args.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    SetStreams(&local_290,(ostream *)out,(ostream *)out);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range2);
    psVar10 = output_local;
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)output_local);
    i = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)psVar10);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&i), bVar3) {
      local_440 = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2);
      bVar3 = std::operator==(local_440,"--build-generator");
      local_eaa = false;
      if (bVar3) {
        local_448.__r = (rep_conflict)MaxDuration();
        bVar3 = std::chrono::operator!=(&local_58,&local_448);
        local_eaa = false;
        if (bVar3) {
          local_450 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
          local_eaa = std::chrono::operator>(&local_58,&local_450);
        }
      }
      if (local_eaa != false) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[15]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&__range2,
                   (char (*) [15])"--test-timeout");
        uVar4 = cmDurationTo<unsigned_int>(&local_58);
        std::__cxx11::to_string((string *)&saveEnv_1,uVar4);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range2,(value_type *)&saveEnv_1);
        std::__cxx11::string::~string((string *)&saveEnv_1);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&__range2,
                 local_440);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    if (environment_local !=
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      poVar7 = std::operator<<((ostream *)environment_local,"* Run internal CTest");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    std::
    unique_ptr<cmSystemTools::SaveRestoreEnvironment,std::default_delete<cmSystemTools::SaveRestoreEnvironment>>
    ::unique_ptr<std::default_delete<cmSystemTools::SaveRestoreEnvironment>,void>
              ((unique_ptr<cmSystemTools::SaveRestoreEnvironment,std::default_delete<cmSystemTools::SaveRestoreEnvironment>>
                *)&local_478);
    if ((timeout.__r._7_1_ & 1) != 0) {
      std::make_unique<cmSystemTools::SaveRestoreEnvironment>();
      std::
      unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
      ::operator=(&local_478,&local_480);
      std::
      unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
      ::~unique_ptr(&local_480);
      cmSystemTools::AppendEnv(environment);
    }
    iVar5 = Run(&local_290,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range2,(string *)retVal_local);
    *(int *)&log_local->_vptr_basic_ostream = iVar5;
    if (retVal_local != (int *)0x0) {
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator+=((string *)retVal_local,local_4a0);
      std::__cxx11::string::~string(local_4a0);
    }
    if ((environment_local !=
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0) && (retVal_local != (int *)0x0)) {
      std::operator<<((ostream *)environment_local,(string *)retVal_local);
    }
    if (retVal_local != (int *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_618);
      poVar7 = std::operator<<((ostream *)local_618,"Internal cmCTest object used to run test.");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<(poVar7,(string *)retVal_local);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar8 = (char *)std::__cxx11::string::c_str();
      Log(this,5,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
          ,0x4f9,pcVar8,false);
      std::__cxx11::string::~string
                ((string *)
                 &tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_618);
    }
    testTimeOut_local.__r._7_1_ = 1;
    std::
    unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
    ::~unique_ptr(&local_478);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2);
    std::__cxx11::ostringstream::~ostringstream
              ((ostringstream *)
               &args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ~cmCTest(&local_290);
  }
  else {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&saveEnv);
    if (retVal_local != (int *)0x0) {
      std::__cxx11::string::clear();
    }
    std::
    unique_ptr<cmSystemTools::SaveRestoreEnvironment,std::default_delete<cmSystemTools::SaveRestoreEnvironment>>
    ::unique_ptr<std::default_delete<cmSystemTools::SaveRestoreEnvironment>,void>
              ((unique_ptr<cmSystemTools::SaveRestoreEnvironment,std::default_delete<cmSystemTools::SaveRestoreEnvironment>>
                *)&local_658);
    if ((timeout.__r._7_1_ & 1) != 0) {
      std::make_unique<cmSystemTools::SaveRestoreEnvironment>();
      std::
      unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
      ::operator=(&local_658,
                  (unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                   *)&builder.Loop);
      std::
      unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
      ::~unique_ptr((unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                     *)&builder.Loop);
      cmSystemTools::AppendEnv(environment);
    }
    cmUVProcessChainBuilder::cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_6c0);
    this_00 = cmUVProcessChainBuilder::AddCommand
                        ((cmUVProcessChainBuilder *)local_6c0,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)output_local);
    cmUVProcessChainBuilder::SetMergedBuiltinStreams(this_00);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_838);
    poVar7 = std::operator<<((ostream *)local_838,"Command is: ");
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)output_local,0);
    poVar7 = std::operator<<(poVar7,(string *)pvVar9);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar8 = (char *)std::__cxx11::string::c_str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x50b,pcVar8,false);
    std::__cxx11::string::~string((string *)&chain);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_838);
    cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)local_860);
    cmProcessOutput::cmProcessOutput
              ((cmProcessOutput *)
               ((long)&outputStream.super_uv_handle_ptr_<uv_pipe_s>.
                       super_uv_handle_ptr_base_<uv_pipe_s>.handle.
                       super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
               7),encoding,0x400);
    ::cm::uv_pipe_ptr::uv_pipe_ptr((uv_pipe_ptr *)&outputHandle);
    ctx = cmUVProcessChain::GetLoop((cmUVProcessChain *)local_860);
    ::cm::uv_pipe_ptr::init((uv_pipe_ptr *)&outputHandle,(EVP_PKEY_CTX *)ctx);
    handle = ::cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_((uv_handle_ptr_ *)&outputHandle);
    iVar5 = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_860);
    uv_pipe_open(handle,iVar5);
    ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_((uv_pipe_ptr *)&outputHandle);
    puStack_8b8 = (undefined1 *)
                  ((long)&outputStream.super_uv_handle_ptr_<uv_pipe_s>.
                          super_uv_handle_ptr_base_<uv_pipe_s>.handle.
                          super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi + 7);
    local_898 = &retVal_local;
    puStack_890 = &saveEnv;
    local_8b0 = (ostream **)&environment_local;
    onRead.processOutput = (cmProcessOutput *)puStack_8b8;
    onRead.this = this;
    onRead.output = (string **)local_898;
    onRead.tempOutput = (vector<char,_std::allocator<char>_> *)puStack_890;
    onRead.log = local_8b0;
    onFinish.processOutput = (cmProcessOutput *)puStack_8b8;
    onFinish.this = this;
    onFinish.log = local_8b0;
    pcStack_8c0 = this;
    local_8a8 = this;
    puStack_8a0 = puStack_8b8;
    local_888 = local_8b0;
    cmUVStreamRead<cmCTest::RunTest(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string*,int*,std::ostream*,std::chrono::duration<double,std::ratio<1l,1l>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*,cmProcessOutput::Encoding)::__0,cmCTest::RunTest(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string*,int*,std::ostream*,std::chrono::duration<double,std::ratio<1l,1l>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*,cmProcessOutput::Encoding)::__1>
              ((uv_stream_t *)local_880,onRead,onFinish);
    rVar1 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_58);
    uVar12 = (ulong)(rVar1 * 1000.0);
    local_8c1 = cmUVProcessChain::Wait
                          ((cmUVProcessChain *)local_860,
                           uVar12 | (long)(rVar1 * 1000.0 - 9.223372036854776e+18) &
                                    (long)uVar12 >> 0x3f);
    std::vector<char,_std::allocator<char>_>::vector
              (&local_8e0,(vector<char,_std::allocator<char>_> *)&saveEnv);
    cmProcessOutput::DecodeText
              ((cmProcessOutput *)
               ((long)&outputStream.super_uv_handle_ptr_<uv_pipe_s>.
                       super_uv_handle_ptr_base_<uv_pipe_s>.handle.
                       super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
               7),&local_8e0,(vector<char,_std::allocator<char>_> *)&saveEnv,0);
    std::vector<char,_std::allocator<char>_>::~vector(&local_8e0);
    local_f3a = false;
    if (retVal_local != (int *)0x0) {
      local_8e8._M_current =
           (char *)std::vector<char,_std::allocator<char>_>::begin
                             ((vector<char,_std::allocator<char>_> *)&saveEnv);
      local_8f0._M_current =
           (char *)std::vector<char,_std::allocator<char>_>::end
                             ((vector<char,_std::allocator<char>_> *)&saveEnv);
      local_f3a = __gnu_cxx::operator!=(&local_8e8,&local_8f0);
    }
    piVar2 = retVal_local;
    if (local_f3a != false) {
      pcVar8 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)&saveEnv);
      std::vector<char,_std::allocator<char>_>::size
                ((vector<char,_std::allocator<char>_> *)&saveEnv);
      std::__cxx11::string::append((char *)piVar2,(ulong)pcVar8);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a68);
    poVar7 = std::operator<<((ostream *)local_a68,"-- Process completed");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar8 = (char *)std::__cxx11::string::c_str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x533,pcVar8,false);
    std::__cxx11::string::~string(local_a88);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a68);
    status._7_1_ = 0;
    if ((local_8c1 & 1) != 0) {
      exception.second.field_2._8_8_ = cmUVProcessChain::GetStatus((cmUVProcessChain *)local_860,0);
      cmUVProcessChain::Status::GetException_abi_cxx11_
                ((pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&outerr.field_2 + 8),(Status *)exception.second.field_2._8_8_);
      if (outerr.field_2._8_4_ == 0) {
        *(int *)&log_local->_vptr_basic_ostream =
             (int)*(undefined8 *)(exception.second.field_2._8_8_ + 8);
        if ((*(int *)&log_local->_vptr_basic_ostream != 0) &&
           (pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                     operator->(&this->Impl), (pPVar6->OutputTestOutputOnTestFailure & 1U) != 0)) {
          OutputTestErrors(this,(vector<char,_std::allocator<char>_> *)&saveEnv);
        }
        status._7_1_ = 1;
      }
      else if (outerr.field_2._8_4_ == 5) {
        cmStrCat<char_const(&)[23],std::__cxx11::string&>
                  ((string *)local_ae0,(char (*) [23])"\n*** ERROR executing: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&exception);
        if (retVal_local != (int *)0x0) {
          std::__cxx11::string::operator+=((string *)retVal_local,(string *)local_ae0);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c58);
        poVar7 = std::operator<<((ostream *)local_c58,(string *)local_ae0);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        Log(this,5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
            ,0x548,pcVar8,false);
        std::__cxx11::string::~string((string *)(outerr_1.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c58);
        std::__cxx11::string::~string((string *)local_ae0);
      }
      else {
        pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                 operator->(&this->Impl);
        if ((pPVar6->OutputTestOutputOnTestFailure & 1U) != 0) {
          OutputTestErrors(this,(vector<char,_std::allocator<char>_> *)&saveEnv);
        }
        *(undefined4 *)&log_local->_vptr_basic_ostream =
             *(undefined4 *)(exception.second.field_2._8_8_ + 0x10);
        cmStrCat<char_const(&)[27],std::__cxx11::string&>
                  ((string *)local_c98,(char (*) [27])"\n*** Exception executing: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&exception);
        if (retVal_local != (int *)0x0) {
          std::__cxx11::string::operator+=((string *)retVal_local,(string *)local_c98);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_e10);
        poVar7 = std::operator<<((ostream *)local_e10,(string *)local_c98);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        Log(this,5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
            ,0x554,pcVar8,false);
        std::__cxx11::string::~string(local_e30);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_e10);
        std::__cxx11::string::~string((string *)local_c98);
      }
      std::
      pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&outerr.field_2 + 8));
    }
    testTimeOut_local.__r._7_1_ = status._7_1_;
    std::unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::~unique_ptr
              ((unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> *)
               local_880);
    ::cm::uv_pipe_ptr::~uv_pipe_ptr((uv_pipe_ptr *)&outputHandle);
    cmUVProcessChain::~cmUVProcessChain((cmUVProcessChain *)local_860);
    cmUVProcessChainBuilder::~cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_6c0);
    std::
    unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
    ::~unique_ptr(&local_658);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)&saveEnv);
  }
  return (bool)(testTimeOut_local.__r._7_1_ & 1);
}

Assistant:

bool cmCTest::RunTest(const std::vector<std::string>& argv,
                      std::string* output, int* retVal, std::ostream* log,
                      cmDuration testTimeOut,
                      std::vector<std::string>* environment, Encoding encoding)
{
  bool modifyEnv = (environment && !environment->empty());

  // determine how much time we have
  cmDuration timeout = this->GetRemainingTimeAllowed();
  if (timeout != cmCTest::MaxDuration()) {
    timeout -= std::chrono::minutes(2);
  }
  if (this->Impl->TimeOut > cmDuration::zero() &&
      this->Impl->TimeOut < timeout) {
    timeout = this->Impl->TimeOut;
  }
  if (testTimeOut > cmDuration::zero() &&
      testTimeOut < this->GetRemainingTimeAllowed()) {
    timeout = testTimeOut;
  }

  // always have at least 1 second if we got to here
  if (timeout <= cmDuration::zero()) {
    timeout = std::chrono::seconds(1);
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
             "Test timeout computed to be: "
               << (timeout == cmCTest::MaxDuration()
                     ? std::string("infinite")
                     : std::to_string(cmDurationTo<unsigned int>(timeout)))
               << "\n");
  if (cmSystemTools::SameFile(argv[0], cmSystemTools::GetCTestCommand()) &&
      !this->Impl->ForceNewCTestProcess) {
    cmCTest inst;
    inst.Impl->ConfigType = this->Impl->ConfigType;
    inst.Impl->TimeOut = timeout;

    // Capture output of the child ctest.
    std::ostringstream oss;
    inst.SetStreams(&oss, &oss);

    std::vector<std::string> args;
    for (auto const& i : argv) {
      // make sure we pass the timeout in for any build and test
      // invocations. Since --build-generator is required this is a
      // good place to check for it, and to add the arguments in
      if (i == "--build-generator" && timeout != cmCTest::MaxDuration() &&
          timeout > cmDuration::zero()) {
        args.emplace_back("--test-timeout");
        args.push_back(std::to_string(cmDurationTo<unsigned int>(timeout)));
      }
      args.emplace_back(i);
    }
    if (log) {
      *log << "* Run internal CTest" << std::endl;
    }

    std::unique_ptr<cmSystemTools::SaveRestoreEnvironment> saveEnv;
    if (modifyEnv) {
      saveEnv = cm::make_unique<cmSystemTools::SaveRestoreEnvironment>();
      cmSystemTools::AppendEnv(*environment);
    }

    *retVal = inst.Run(args, output);
    if (output) {
      *output += oss.str();
    }
    if (log && output) {
      *log << *output;
    }
    if (output) {
      cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                 "Internal cmCTest object used to run test." << std::endl
                                                             << *output
                                                             << std::endl);
    }

    return true;
  }
  std::vector<char> tempOutput;
  if (output) {
    output->clear();
  }

  std::unique_ptr<cmSystemTools::SaveRestoreEnvironment> saveEnv;
  if (modifyEnv) {
    saveEnv = cm::make_unique<cmSystemTools::SaveRestoreEnvironment>();
    cmSystemTools::AppendEnv(*environment);
  }

  cmUVProcessChainBuilder builder;
  builder.AddCommand(argv).SetMergedBuiltinStreams();
  cmCTestLog(this, DEBUG, "Command is: " << argv[0] << std::endl);
  auto chain = builder.Start();

  cmProcessOutput processOutput(encoding);
  cm::uv_pipe_ptr outputStream;
  outputStream.init(chain.GetLoop(), 0);
  uv_pipe_open(outputStream, chain.OutputStream());
  auto outputHandle = cmUVStreamRead(
    outputStream,
    [this, &processOutput, &output, &tempOutput,
     &log](std::vector<char> data) {
      std::string strdata;
      processOutput.DecodeText(data.data(), data.size(), strdata);
      if (output) {
        cm::append(tempOutput, data.data(), data.data() + data.size());
      }
      cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                 cmCTestLogWrite(strdata.c_str(), strdata.size()));
      if (log) {
        log->write(strdata.c_str(), strdata.size());
      }
    },
    [this, &processOutput, &log]() {
      std::string strdata;
      processOutput.DecodeText(std::string(), strdata);
      if (!strdata.empty()) {
        cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                   cmCTestLogWrite(strdata.c_str(), strdata.size()));
        if (log) {
          log->write(strdata.c_str(), strdata.size());
        }
      }
    });

  bool complete = chain.Wait(static_cast<uint64_t>(timeout.count() * 1000.0));
  processOutput.DecodeText(tempOutput, tempOutput);
  if (output && tempOutput.begin() != tempOutput.end()) {
    output->append(tempOutput.data(), tempOutput.size());
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
             "-- Process completed" << std::endl);

  bool result = false;

  if (complete) {
    auto const& status = chain.GetStatus(0);
    auto exception = status.GetException();
    switch (exception.first) {
      case cmUVProcessChain::ExceptionCode::None:
        *retVal = static_cast<int>(status.ExitStatus);
        if (*retVal != 0 && this->Impl->OutputTestOutputOnTestFailure) {
          this->OutputTestErrors(tempOutput);
        }
        result = true;
        break;
      case cmUVProcessChain::ExceptionCode::Spawn: {
        std::string outerr =
          cmStrCat("\n*** ERROR executing: ", exception.second);
        if (output) {
          *output += outerr;
        }
        cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, outerr << std::endl);
      } break;
      default: {
        if (this->Impl->OutputTestOutputOnTestFailure) {
          this->OutputTestErrors(tempOutput);
        }
        *retVal = status.TermSignal;
        std::string outerr =
          cmStrCat("\n*** Exception executing: ", exception.second);
        if (output) {
          *output += outerr;
        }
        cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, outerr << std::endl);
      } break;
    }
  }

  return result;
}